

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void init_default_suite_when_needed(void)

{
  if (default_suite_initialized == 0) {
    default_suite.id = -1;
    default_suite.kind = 4;
    default_suite.previous = (pcut_item_t *)0x0;
    default_suite.next = (pcut_item_t *)0x0;
    default_suite.name = "Default";
    default_suite.setup_func = (pcut_setup_func_t)0x0;
    default_suite.teardown_func = (pcut_setup_func_t)0x0;
  }
  return;
}

Assistant:

static void init_default_suite_when_needed(void) {
	if (default_suite_initialized) {
		return;
	}
	default_suite.id = -1;
	default_suite.kind = PCUT_KIND_TESTSUITE;
	default_suite.previous = NULL;
	default_suite.next = NULL;
	default_suite.name = "Default";
	default_suite.setup_func = NULL;
	default_suite.teardown_func = NULL;
}